

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine_p.h
# Opt level: O1

void __thiscall
QGridLayoutItem::insertOrRemoveRows(QGridLayoutItem *this,int row,int delta,Orientation orientation)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  
  lVar3 = (long)(int)orientation;
  iVar2 = (this->q_firstRows).m_data[lVar3 + -1];
  if (iVar2 < row) {
    iVar1 = (this->q_firstRows).m_data[lVar3 + 1];
    if (iVar2 + iVar1 + -1 < row) {
      return;
    }
    piVar4 = (this->q_firstRows).m_data + lVar3 + 1;
    iVar2 = iVar1;
  }
  else {
    piVar4 = (this->q_firstRows).m_data + lVar3 + -1;
  }
  *piVar4 = iVar2 + delta;
  return;
}

Assistant:

constexpr const T &operator[](Qt::Orientation o) const { return m_data[map(o)]; }